

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall
llvm::yaml::Scanner::findBlockScalarIndent
          (Scanner *this,uint *BlockIndent,uint BlockExitIndent,uint *LineBreaks,bool *IsDone)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  iterator pcVar4;
  char *unaff_RBX;
  char *pcVar5;
  char *pcVar6;
  uint MaxAllSpaceLineCharacters;
  uint uVar7;
  bool bVar8;
  Twine local_58;
  uint *local_40;
  uint local_34;
  
  uVar7 = 0;
  local_40 = BlockIndent;
  local_34 = BlockExitIndent;
  while( true ) {
    pcVar5 = this->Current;
    do {
      pcVar6 = pcVar5;
      if (this->End != pcVar5) {
        pcVar6 = pcVar5 + (*pcVar5 == ' ');
      }
      bVar8 = pcVar6 != pcVar5;
      pcVar5 = pcVar6;
    } while (bVar8);
    this->Column = this->Column + ((int)pcVar6 - (int)this->Current);
    this->Current = pcVar6;
    pcVar4 = skip_nb_char(this,pcVar6);
    pcVar5 = this->Current;
    if (pcVar4 != pcVar5) break;
    pcVar2 = this->End;
    pcVar6 = pcVar5;
    if (pcVar2 != pcVar5) {
      if (*pcVar5 == '\n') {
        pcVar6 = pcVar5 + 1;
      }
      else if (((*pcVar5 == '\r') && (pcVar6 = pcVar5 + 1, pcVar6 != pcVar2)) && (pcVar5[1] == '\n')
              ) {
        pcVar6 = pcVar5 + 2;
      }
    }
    uVar1 = this->Column;
    pcVar3 = pcVar5;
    if (uVar1 <= uVar7) {
      uVar1 = uVar7;
      pcVar3 = unaff_RBX;
    }
    if (pcVar6 != pcVar5) {
      uVar7 = uVar1;
      unaff_RBX = pcVar3;
    }
    if ((pcVar2 == pcVar5) || (bVar8 = consumeLineBreakIfPresent(this), !bVar8)) goto LAB_00dbf9e7;
    *LineBreaks = *LineBreaks + 1;
  }
  uVar1 = this->Column;
  if (local_34 < uVar1) {
    *local_40 = uVar1;
    if (uVar7 <= uVar1) {
      return true;
    }
    Twine::Twine(&local_58,"Leading all-spaces line must be smaller than the block indent");
    setError(this,&local_58,unaff_RBX);
    return false;
  }
LAB_00dbf9e7:
  *IsDone = true;
  return true;
}

Assistant:

bool Scanner::findBlockScalarIndent(unsigned &BlockIndent,
                                    unsigned BlockExitIndent,
                                    unsigned &LineBreaks, bool &IsDone) {
  unsigned MaxAllSpaceLineCharacters = 0;
  StringRef::iterator LongestAllSpaceLine;

  while (true) {
    advanceWhile(&Scanner::skip_s_space);
    if (skip_nb_char(Current) != Current) {
      // This line isn't empty, so try and find the indentation.
      if (Column <= BlockExitIndent) { // End of the block literal.
        IsDone = true;
        return true;
      }
      // We found the block's indentation.
      BlockIndent = Column;
      if (MaxAllSpaceLineCharacters > BlockIndent) {
        setError(
            "Leading all-spaces line must be smaller than the block indent",
            LongestAllSpaceLine);
        return false;
      }
      return true;
    }
    if (skip_b_break(Current) != Current &&
        Column > MaxAllSpaceLineCharacters) {
      // Record the longest all-space line in case it's longer than the
      // discovered block indent.
      MaxAllSpaceLineCharacters = Column;
      LongestAllSpaceLine = Current;
    }

    // Check for EOF.
    if (Current == End) {
      IsDone = true;
      return true;
    }

    if (!consumeLineBreakIfPresent()) {
      IsDone = true;
      return true;
    }
    ++LineBreaks;
  }
  return true;
}